

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

int __thiscall
Js::ByteCodeWriter::AuxNoReg(ByteCodeWriter *this,OpCode op,void *buffer,int byteCount,int C1)

{
  uint uVar1;
  uint local_40;
  int local_3c;
  OpLayoutAuxNoReg data;
  
  data = (OpLayoutAuxNoReg)buffer;
  CheckOpen(this);
  uVar1 = (this->m_auxiliaryData).currentOffset;
  if (byteCount != 0) {
    Data::Encode(&this->m_auxiliaryData,(void *)data,byteCount);
  }
  local_40 = uVar1;
  local_3c = C1;
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
  Data::Write(&this->m_byteCodeData,&local_40,8);
  return uVar1;
}

Assistant:

int ByteCodeWriter::AuxNoReg(OpCode op, const void* buffer, int byteCount, int C1)
    {
        CheckOpen();

        //
        // Write the buffer's contents
        //

        int currentOffset = InsertAuxiliaryData(buffer, byteCount);

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutAuxNoReg data;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);

        return currentOffset;
    }